

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Q3BSPFileImporter.cpp
# Opt level: O1

void __thiscall
Assimp::Q3BSPFileImporter::createMaterials
          (Q3BSPFileImporter *this,Q3BSPModel *pModel,aiScene *pScene,ZipArchiveIOSystem *pArchive)

{
  char cVar1;
  pointer __src;
  Q3BSPFileImporter *pQVar2;
  bool bVar3;
  int textureId;
  int lightmapId;
  aiMaterial **ppaVar4;
  aiMaterial *this_00;
  long lVar5;
  Logger *this_01;
  _Base_ptr p_Var6;
  ulong uVar7;
  aiTexture **__dest;
  aiScene *paVar8;
  char *pcVar9;
  size_t __n;
  string tmp1;
  string texName;
  string tmp;
  string matName;
  aiString aiMatName;
  char local_4da [2];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4d8;
  Q3BSPFileImporter *local_4b8;
  Q3BSPModel *local_4b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4a8;
  char *local_488;
  long local_480;
  char local_478 [16];
  undefined1 *local_468;
  ulong local_460;
  undefined1 local_458 [16];
  ZipArchiveIOSystem *local_448;
  _Rb_tree_node_base *local_440;
  aiString local_434;
  
  uVar7 = (this->m_MaterialLookupMap)._M_t._M_impl.super__Rb_tree_header._M_node_count;
  if (uVar7 != 0) {
    local_4b0 = pModel;
    local_448 = pArchive;
    ppaVar4 = (aiMaterial **)operator_new__(-(ulong)(uVar7 >> 0x3d != 0) | uVar7 << 3);
    pScene->mMaterials = ppaVar4;
    local_434.length = 0;
    local_434.data[0] = '\0';
    memset(local_434.data + 1,0x1b,0x3ff);
    p_Var6 = (this->m_MaterialLookupMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    local_440 = &(this->m_MaterialLookupMap)._M_t._M_impl.super__Rb_tree_header._M_header;
    local_4b8 = this;
    if (p_Var6 != local_440) {
      do {
        local_468 = local_458;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_468,*(long *)(p_Var6 + 1),
                   (long)&(p_Var6[1]._M_parent)->_M_color + *(long *)(p_Var6 + 1));
        uVar7 = local_460;
        if (local_460 != 0) {
          if (local_460 < 0x400) {
            local_434.length = (ai_uint32)local_460;
            memcpy(local_434.data,local_468,local_460);
            local_434.data[uVar7] = '\0';
          }
          this_00 = (aiMaterial *)operator_new(0x10);
          aiMaterial::aiMaterial(this_00);
          aiMaterial::AddProperty(this_00,&local_434,"?mat.name",0,0);
          lightmapId = -1;
          if (local_460 == 0) {
            textureId = -1;
          }
          else {
            lVar5 = std::__cxx11::string::find((char *)&local_468,0x77bcaa,0);
            textureId = -1;
            if (lVar5 != -1) {
              std::__cxx11::string::substr((ulong)&local_4d8,(ulong)&local_468);
              std::__cxx11::string::substr((ulong)&local_488,(ulong)&local_468);
              textureId = atoi(local_4d8._M_dataplus._M_p);
              pcVar9 = local_488;
              lightmapId = atoi(local_488);
              if (pcVar9 != local_478) {
                operator_delete(pcVar9);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_4d8._M_dataplus._M_p != &local_4d8.field_2) {
                operator_delete(local_4d8._M_dataplus._M_p);
              }
            }
          }
          if ((textureId != -1) &&
             ((local_4b0->m_Textures).
              super__Vector_base<Assimp::Q3BSP::sQ3BSPTexture_*,_std::allocator<Assimp::Q3BSP::sQ3BSPTexture_*>_>
              ._M_impl.super__Vector_impl_data._M_start[textureId] != (sQ3BSPTexture *)0x0)) {
            local_488 = local_478;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_488,"*","");
            local_4a8._M_dataplus._M_p = (pointer)&local_4a8.field_2;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_4a8,"");
            std::__cxx11::string::append((char *)&local_488);
            std::__cxx11::string::append((char *)&local_488);
            paVar8 = (aiScene *)0x7c3fe0;
            std::__cxx11::string::_M_replace
                      ((ulong)&local_4a8,0,(char *)local_4a8._M_string_length,0x7c3fe0);
            if (local_480 != 0) {
              local_4d8._M_dataplus._M_p = (pointer)&local_4d8.field_2;
              local_4d8.field_2._M_allocated_capacity._0_2_ = 0x2f;
              local_4d8._M_string_length = 1;
              local_4da[0] = '/';
              local_4da[1] = '\\';
              std::__cxx11::string::_M_assign((string *)&local_4a8);
              lVar5 = 0;
              do {
                if ((char *)local_4a8._M_string_length != (char *)0x0) {
                  cVar1 = local_4da[lVar5];
                  paVar8 = (aiScene *)CONCAT71((int7)((ulong)paVar8 >> 8),cVar1);
                  pcVar9 = (char *)0x0;
                  do {
                    if (local_4a8._M_dataplus._M_p[(long)pcVar9] == cVar1) {
                      local_4a8._M_dataplus._M_p[(long)pcVar9] = *local_4d8._M_dataplus._M_p;
                    }
                    pcVar9 = pcVar9 + 1;
                  } while (pcVar9 < local_4a8._M_string_length);
                }
                lVar5 = lVar5 + 1;
              } while (lVar5 != 2);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_4d8._M_dataplus._M_p != &local_4d8.field_2) {
                operator_delete(local_4d8._M_dataplus._M_p);
              }
            }
            bVar3 = importTextureFromArchive(local_4b8,local_4b0,local_448,paVar8,this_00,textureId)
            ;
            if (!bVar3) {
              this_01 = DefaultLogger::get();
              std::operator+(&local_4d8,"Cannot import texture from archive ",&local_4a8);
              Logger::error(this_01,local_4d8._M_dataplus._M_p);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_4d8._M_dataplus._M_p != &local_4d8.field_2) {
                operator_delete(local_4d8._M_dataplus._M_p);
              }
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_4a8._M_dataplus._M_p != &local_4a8.field_2) {
              operator_delete(local_4a8._M_dataplus._M_p);
            }
            if (local_488 != local_478) {
              operator_delete(local_488);
            }
          }
          if (lightmapId != -1) {
            importLightmap(local_4b8,local_4b0,pScene,this_00,lightmapId);
          }
          pScene->mMaterials[pScene->mNumMaterials] = this_00;
          pScene->mNumMaterials = pScene->mNumMaterials + 1;
        }
        if (local_468 != local_458) {
          operator_delete(local_468);
        }
        p_Var6 = (_Base_ptr)std::_Rb_tree_increment(p_Var6);
      } while (p_Var6 != local_440);
    }
    pQVar2 = local_4b8;
    uVar7 = (long)(local_4b8->mTextures).
                  super__Vector_base<aiTexture_*,_std::allocator<aiTexture_*>_>._M_impl.
                  super__Vector_impl_data._M_finish -
            (long)(local_4b8->mTextures).
                  super__Vector_base<aiTexture_*,_std::allocator<aiTexture_*>_>._M_impl.
                  super__Vector_impl_data._M_start;
    pScene->mNumTextures = (uint)(uVar7 >> 3);
    __dest = (aiTexture **)operator_new__(uVar7 & 0x7fffffff8);
    pScene->mTextures = __dest;
    __src = (pQVar2->mTextures).super__Vector_base<aiTexture_*,_std::allocator<aiTexture_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
    __n = (long)(pQVar2->mTextures).super__Vector_base<aiTexture_*,_std::allocator<aiTexture_*>_>.
                _M_impl.super__Vector_impl_data._M_finish - (long)__src;
    if (__n != 0) {
      memmove(__dest,__src,__n);
    }
  }
  return;
}

Assistant:

void Q3BSPFileImporter::createMaterials( const Q3BSP::Q3BSPModel *pModel, aiScene* pScene,
    ZipArchiveIOSystem *pArchive ) {
    if ( m_MaterialLookupMap.empty() ) {
        return;
    }

    pScene->mMaterials = new aiMaterial*[ m_MaterialLookupMap.size() ];
    aiString aiMatName;
    int textureId( -1 ), lightmapId( -1 );
    for ( FaceMapIt it = m_MaterialLookupMap.begin(); it != m_MaterialLookupMap.end();
        ++it ) {
        const std::string matName( it->first );
        if ( matName.empty() ) {
            continue;
        }

        aiMatName.Set( matName );
        aiMaterial *pMatHelper = new aiMaterial;
        pMatHelper->AddProperty( &aiMatName, AI_MATKEY_NAME );

        extractIds( matName, textureId, lightmapId );

        // Adding the texture
        if ( -1 != textureId ) {
            sQ3BSPTexture *pTexture = pModel->m_Textures[ textureId ];
            if ( nullptr != pTexture ) {
                std::string tmp( "*" ), texName( "" );
                tmp += pTexture->strName;
                tmp += ".jpg";
                normalizePathName( tmp, texName );

                if ( !importTextureFromArchive( pModel, pArchive, pScene, pMatHelper, textureId ) ) {
                    ASSIMP_LOG_ERROR("Cannot import texture from archive " + texName);
                }
            }

        }
        if ( -1 != lightmapId )
        {
            importLightmap( pModel, pScene, pMatHelper, lightmapId );
        }
        pScene->mMaterials[ pScene->mNumMaterials ] = pMatHelper;
        pScene->mNumMaterials++;
    }
    pScene->mNumTextures = static_cast<unsigned int>(mTextures.size());
    pScene->mTextures = new aiTexture*[ pScene->mNumTextures ];
    std::copy( mTextures.begin(), mTextures.end(), pScene->mTextures );
}